

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O1

bool __thiscall
cmdline::parser::option_with_value<int>::set(option_with_value<int> *this,string *value)

{
  int iVar1;
  
  iVar1 = (*(this->super_option_base)._vptr_option_base[0xc])();
  this->actual = iVar1;
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value) {
      try {
        actual = read(value);
        has = true;
      } catch (const std::exception &e) {
        return false;
      }
      return true;
    }